

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall mario::TimerQueue::cancel(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = this->_loop;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x28);
  *(code **)local_50._M_unused._0_8_ = cancelInLoop;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(Timer **)((long)local_50._M_unused._0_8_ + 0x10) = timerId._value;
  *(int64_t *)((long)local_50._M_unused._0_8_ + 0x18) = timerId._seq;
  *(TimerQueue **)((long)local_50._M_unused._0_8_ + 0x20) = this;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::TimerId))(mario::TimerId)>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::TimerId))(mario::TimerId)>_>
             ::_M_manager;
  EventLoop::runInLoop(this_00,(Functor *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void TimerQueue::cancel(TimerId timerId) {
    _loop->runInLoop(
            std::bind(&TimerQueue::cancelInLoop, this, timerId)
            );
}